

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O3

uint32_t Predictor8_SSE2(uint32_t *left,uint32_t *top)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  
  cVar1 = pavgb((byte)top[-1],(byte)*top);
  cVar2 = pavgb(*(byte *)((long)top + -3),*(byte *)((long)top + 1));
  cVar3 = pavgb(*(byte *)((long)top + -2),*(byte *)((long)top + 2));
  cVar4 = pavgb(*(byte *)((long)top + -1),*(byte *)((long)top + 3));
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  return CONCAT13(cVar4 - ((*(byte *)((long)top + 3) ^ *(byte *)((long)top + -1)) & 1),
                  CONCAT12(cVar3 - ((*(byte *)((long)top + 2) ^ *(byte *)((long)top + -2)) & 1),
                           CONCAT11(cVar2 - ((*(byte *)((long)top + 1) ^ *(byte *)((long)top + -3))
                                            & 1),cVar1 - (((byte)*top ^ (byte)top[-1]) & 1))));
}

Assistant:

static WEBP_INLINE void Average2_uint32_SSE2(const uint32_t a0,
                                             const uint32_t a1,
                                             __m128i* const avg) {
  // (a + b) >> 1 = ((a + b + 1) >> 1) - ((a ^ b) & 1)
  const __m128i ones = _mm_set1_epi8(1);
  const __m128i A0 = _mm_cvtsi32_si128(a0);
  const __m128i A1 = _mm_cvtsi32_si128(a1);
  const __m128i avg1 = _mm_avg_epu8(A0, A1);
  const __m128i one = _mm_and_si128(_mm_xor_si128(A0, A1), ones);
  *avg = _mm_sub_epi8(avg1, one);
}